

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeTokenMap.cpp
# Opt level: O3

void __thiscall xercesc_4_0::RangeTokenMap::buildTokenRanges(RangeTokenMap *this)

{
  short *psVar1;
  short *psVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  RefHashTableBucketElem<xercesc_4_0::RangeFactory> *pRVar7;
  undefined2 *puVar8;
  long lVar9;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->fRangeMap->fHashModulus;
  pRVar7 = this->fRangeMap->fBucketList
           [SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1fc1a)) % auVar3,0) & 0xffffffff];
  puVar8 = (undefined2 *)pRVar7->fKey;
  while (puVar8 != &fgXMLCategory) {
    if (puVar8 != (undefined2 *)0x0) {
      lVar9 = 0;
      do {
        psVar1 = (short *)((long)&fgXMLCategory + lVar9);
        if (*psVar1 == 0) {
          if (puVar8[3] == 0) goto LAB_00239a9d;
          break;
        }
        psVar2 = (short *)((long)puVar8 + lVar9);
        lVar9 = lVar9 + 2;
      } while (*psVar1 == *psVar2);
    }
    pRVar7 = pRVar7->fNext;
    puVar8 = (undefined2 *)pRVar7->fKey;
  }
LAB_00239a9d:
  (*pRVar7->fData->_vptr_RangeFactory[3])();
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->fRangeMap->fHashModulus;
  pRVar7 = this->fRangeMap->fBucketList
           [SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x85b18a3)) % auVar4,0) & 0xffffffff];
  puVar8 = (undefined2 *)pRVar7->fKey;
  while (puVar8 != &fgASCIICategory) {
    if (puVar8 != (undefined2 *)0x0) {
      lVar9 = 0;
      do {
        psVar1 = (short *)((long)&fgASCIICategory + lVar9);
        if (*psVar1 == 0) {
          if (puVar8[5] == 0) goto LAB_00239b02;
          break;
        }
        psVar2 = (short *)((long)puVar8 + lVar9);
        lVar9 = lVar9 + 2;
      } while (*psVar1 == *psVar2);
    }
    pRVar7 = pRVar7->fNext;
    puVar8 = (undefined2 *)pRVar7->fKey;
  }
LAB_00239b02:
  (*pRVar7->fData->_vptr_RangeFactory[3])();
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->fRangeMap->fHashModulus;
  pRVar7 = this->fRangeMap->fBucketList
           [SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x3d1044ba28)) % auVar5,0)];
  puVar8 = (undefined2 *)pRVar7->fKey;
  while (puVar8 != &fgUnicodeCategory) {
    if (puVar8 != (undefined2 *)0x0) {
      lVar9 = 0;
      do {
        psVar1 = (short *)((long)&fgUnicodeCategory + lVar9);
        if (*psVar1 == 0) {
          if (puVar8[7] == 0) goto LAB_00239b6a;
          break;
        }
        psVar2 = (short *)((long)puVar8 + lVar9);
        lVar9 = lVar9 + 2;
      } while (*psVar1 == *psVar2);
    }
    pRVar7 = pRVar7->fNext;
    puVar8 = (undefined2 *)pRVar7->fKey;
  }
LAB_00239b6a:
  (*pRVar7->fData->_vptr_RangeFactory[3])();
  auVar6._8_8_ = 0;
  auVar6._0_8_ = this->fRangeMap->fHashModulus;
  pRVar7 = this->fRangeMap->fBucketList
           [SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8755019)) % auVar6,0) & 0xffffffff];
  puVar8 = (undefined2 *)pRVar7->fKey;
  do {
    if (puVar8 == &fgBlockCategory) {
LAB_00239bcf:
      (*pRVar7->fData->_vptr_RangeFactory[3])(pRVar7->fData,this);
      return;
    }
    if (puVar8 != (undefined2 *)0x0) {
      lVar9 = 0;
      do {
        psVar1 = (short *)((long)&fgBlockCategory + lVar9);
        if (*psVar1 == 0) {
          if (puVar8[5] == 0) goto LAB_00239bcf;
          break;
        }
        psVar2 = (short *)((long)puVar8 + lVar9);
        lVar9 = lVar9 + 2;
      } while (*psVar1 == *psVar2);
    }
    pRVar7 = pRVar7->fNext;
    puVar8 = (undefined2 *)pRVar7->fKey;
  } while( true );
}

Assistant:

void RangeTokenMap::buildTokenRanges()
{
    // Build ranges */
    RangeFactory* rangeFactory = fRangeMap->get(fgXMLCategory);
    rangeFactory->buildRanges(this);

    rangeFactory = fRangeMap->get(fgASCIICategory);
    rangeFactory->buildRanges(this);

    rangeFactory = fRangeMap->get(fgUnicodeCategory);
    rangeFactory->buildRanges(this);

    rangeFactory = fRangeMap->get(fgBlockCategory);
    rangeFactory->buildRanges(this);
}